

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeDrawList(ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiContext *pIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ImGuiWindow *window_1;
  ImDrawList *pIVar9;
  long lVar10;
  bool show_mesh;
  ImGuiContext *g;
  char *pcVar11;
  uint uVar12;
  ImDrawCmd *pIVar13;
  uint uVar14;
  ImGuiContext *pIVar15;
  ImVec4 *buf_00;
  int iVar16;
  long lVar17;
  ulong uVar18;
  undefined4 uVar19;
  float fVar20;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  undefined1 local_1e8 [24];
  void *pvStack_1d0;
  ImDrawList *local_1c8;
  ImDrawCmd *local_1c0;
  unsigned_short *local_1b8;
  ImGuiContext *local_1b0;
  ImDrawList *local_1a8;
  long local_1a0;
  ulong local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pIVar15 = GImGui;
  iVar16 = (draw_list->CmdBuffer).Size;
  lVar17 = (long)iVar16;
  if ((0 < lVar17) && (pIVar13 = (draw_list->CmdBuffer).Data, pIVar13[lVar17 + -1].ElemCount == 0))
  {
    iVar16 = iVar16 - (uint)(pIVar13[lVar17 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  pcVar11 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar11 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar11,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar16);
  pIVar4 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar2 = pIVar4->CurrentWindow;
  if (pIVar2->DrawList == draw_list) {
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    pIVar9 = GetViewportDrawList(*(pIVar4->Viewports).Data,1,"##Foreground");
    local_1c8 = pIVar9;
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar6) {
        return;
      }
    }
    else {
      bVar7 = IsItemHovered(0);
      if (pIVar9 != (ImDrawList *)0x0 && bVar7) {
        local_168[0].y = (window->Size).y + (window->Pos).y;
        local_168[0].x = (window->Size).x + (window->Pos).x;
        ImDrawList::AddRect(local_1c8,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0,1.0);
      }
      if (!bVar6) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    if (0 < iVar16) {
      pIVar13 = (draw_list->CmdBuffer).Data;
      lVar17 = (long)iVar16 * 0x38;
      local_1b0 = pIVar15;
      local_1a8 = draw_list;
      local_1a0 = lVar17;
      do {
        if (pIVar13->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar13->ClipRect).x,0),
                         SUB84((double)(pIVar13->ClipRect).y,0),(double)(pIVar13->ClipRect).z,
                         (double)(pIVar13->ClipRect).w,(ulong)pIVar13->ElemCount / 3,
                         pIVar13->TextureId);
          bVar6 = TreeNode((void *)(((long)pIVar13 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          bVar7 = IsItemHovered(0);
          pIVar9 = local_1c8;
          if (bVar7) {
            if ((pIVar15->DebugMetricsConfig).ShowDrawCmdMesh == false) {
              if ((local_1c8 != (ImDrawList *)0x0) &&
                 ((pIVar15->DebugMetricsConfig).ShowDrawCmdBoundingBoxes != false)) {
                show_mesh = false;
                bVar7 = true;
                goto LAB_001f7b4f;
              }
            }
            else if (local_1c8 != (ImDrawList *)0x0) {
              bVar7 = (pIVar15->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
              show_mesh = true;
LAB_001f7b4f:
              DebugNodeDrawCmdShowMeshAndBoundingBox(local_1c8,draw_list,pIVar13,show_mesh,bVar7);
            }
          }
          lVar17 = local_1a0;
          if (bVar6) {
            if ((draw_list->IdxBuffer).Size < 1) {
              local_1b8 = (unsigned_short *)0x0;
            }
            else {
              local_1b8 = (draw_list->IdxBuffer).Data;
            }
            uVar1 = pIVar13->VtxOffset;
            uVar12 = pIVar13->IdxOffset;
            pIVar3 = (draw_list->VtxBuffer).Data;
            uVar8 = pIVar13->ElemCount + uVar12;
            uVar19 = 0;
            if (uVar12 < uVar8) {
              fVar20 = 0.0;
              do {
                local_1e8._0_4_ = 0.0;
                local_1e8._4_4_ = 0.0;
                local_1e8._8_4_ = 0;
                local_1e8._12_4_ = 0.0;
                local_1e8._16_8_ = 0;
                lVar17 = 0;
                do {
                  uVar14 = (uint)((ulong)uVar12 + lVar17);
                  if (local_1b8 != (unsigned_short *)0x0) {
                    uVar14 = (uint)local_1b8[(ulong)uVar12 + lVar17 & 0xffffffff];
                  }
                  *(ImVec2 *)(local_1e8 + lVar17 * 8) = pIVar3[(ulong)uVar1 + (ulong)uVar14].pos;
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
                fVar20 = fVar20 + ABS(((float)local_1e8._4_4_ - (float)local_1e8._12_4_) *
                                      (float)local_1e8._16_4_ +
                                      ((float)local_1e8._12_4_ - (float)local_1e8._20_4_) *
                                      (float)local_1e8._0_4_ +
                                      ((float)local_1e8._20_4_ - (float)local_1e8._4_4_) *
                                      (float)local_1e8._8_4_) * 0.5;
                uVar12 = uVar12 + 3;
              } while (uVar12 < uVar8);
              uVar19 = SUB84((double)fVar20,0);
            }
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           uVar19);
            local_1e8._0_4_ = 0.0;
            local_1e8._4_4_ = 0.0;
            Selectable((char *)local_168,false,0,(ImVec2 *)local_1e8);
            bVar6 = IsItemHovered(0);
            if (pIVar9 != (ImDrawList *)0x0 && bVar6) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(pIVar9,draw_list,pIVar13,true,false);
            }
            local_1e8._0_4_ = 0.0;
            local_1e8._4_4_ = 0.0;
            local_1e8._16_8_ = 0;
            pvStack_1d0 = (void *)0x0;
            local_1e8._8_4_ = -1;
            local_1e8._12_4_ = 0.0;
            local_1c0 = pIVar13;
            ImGuiListClipper::Begin((ImGuiListClipper *)local_1e8,pIVar13->ElemCount / 3,-1.0);
            while (bVar6 = ImGuiListClipper::Step((ImGuiListClipper *)local_1e8), bVar6) {
              if ((int)local_1e8._0_4_ < (int)local_1e8._4_4_) {
                uVar18 = (ulong)(local_1e8._0_4_ * 3 + local_1c0->IdxOffset);
                fVar20 = (float)local_1e8._0_4_;
                do {
                  puVar5 = local_1b8;
                  local_198 = (ulong)(uint)fVar20;
                  local_188[0].x = 0.0;
                  local_188[0].y = 0.0;
                  local_188[1].x = 0.0;
                  local_188[1].y = 0.0;
                  local_188[2].x = 0.0;
                  local_188[2].y = 0.0;
                  lVar17 = 0;
                  buf_00 = local_168;
                  do {
                    if (local_1b8 == (unsigned_short *)0x0) {
                      uVar12 = (int)uVar18 + (int)lVar17;
                    }
                    else {
                      uVar12 = (uint)puVar5[(int)uVar18 + lVar17];
                    }
                    lVar10 = (long)(int)uVar12;
                    local_188[lVar17] = pIVar3[(ulong)uVar1 + lVar10].pos;
                    pcVar11 = "     ";
                    if (lVar17 == 0) {
                      pcVar11 = "Vert:";
                    }
                    iVar16 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                            "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                            ,SUB84((double)pIVar3[(ulong)uVar1 + lVar10].pos.x,0),
                                            SUB84((double)pIVar3[(ulong)uVar1 + lVar10].pos.y,0),
                                            (double)pIVar3[(ulong)uVar1 + lVar10].uv.x,
                                            (double)pIVar3[(ulong)uVar1 + lVar10].uv.y,pcVar11,
                                            (uVar18 & 0xffffffff) + lVar17,
                                            (ulong)pIVar3[(ulong)uVar1 + lVar10].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar16);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  local_190.x = 0.0;
                  local_190.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_190);
                  pIVar9 = local_1c8;
                  if ((local_1c8 != (ImDrawList *)0x0) && (bVar6 = IsItemHovered(0), bVar6)) {
                    uVar12 = pIVar9->Flags;
                    pIVar9->Flags = uVar12 & 0xfffffffe;
                    ImDrawList::AddPolyline(pIVar9,local_188,3,0xff00ffff,1,1.0);
                    pIVar9->Flags = uVar12;
                  }
                  uVar18 = (uVar18 & 0xffffffff) + 3;
                  fVar20 = (float)((int)local_198 + 1);
                } while ((int)fVar20 < (int)local_1e8._4_4_);
              }
            }
            TreePop();
            ImGuiListClipper::End((ImGuiListClipper *)local_1e8);
            pIVar13 = local_1c0;
            pIVar15 = local_1b0;
            lVar17 = local_1a0;
            draw_list = local_1a8;
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar13->UserCallback,pIVar13->UserCallbackData);
        }
        pIVar13 = pIVar13 + 1;
      } while (pIVar13 < (ImDrawCmd *)((long)&(((draw_list->CmdBuffer).Data)->ClipRect).x + lVar17))
      ;
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered() && fg_draw_list)
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}